

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::do_move(Board *this,uint turn,Point *source,Point *destination)

{
  shared_ptr<Piece> *__r;
  shared_ptr<Piece> *this_00;
  __shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *this_02;
  Point *destination_local;
  Point *source_local;
  uint turn_local;
  Board *this_local;
  
  __r = TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[](&this->m_board,source);
  this_00 = TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[](&this->m_board,destination);
  std::shared_ptr<Piece>::operator=(this_00,__r);
  this_01 = (__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[](&this->m_board,destination);
  this_02 = std::__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      (this_01);
  Piece::do_move(this_02,turn,destination);
  return;
}

Assistant:

void Board::do_move(unsigned int turn, const Point &source, const Point &destination) {
    m_board[destination] = move(m_board[source]);
    m_board[destination]->do_move(turn, destination);
}